

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  iterator *piVar2;
  reference this_00;
  bool local_271;
  undefined1 local_258 [8];
  string_type s;
  iterator __end4;
  iterator __begin4;
  iterator local_178;
  input_iterator_range<ghc::filesystem::path::iterator> local_138;
  input_iterator_range<ghc::filesystem::path::iterator> *local_b8;
  input_iterator_range<ghc::filesystem::path::iterator> *__range4;
  iterator local_a0;
  byte local_59;
  iterator local_58;
  path *local_18;
  path *this_local;
  path *pp;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = has_relative_path(this);
  if (bVar1) {
    bVar1 = empty(this);
    local_59 = 0;
    __range4._3_1_ = 0;
    local_271 = true;
    if (!bVar1) {
      begin(&local_58,this);
      local_59 = 1;
      end(&local_a0,this);
      __range4._3_1_ = 1;
      piVar2 = iterator::operator--(&local_a0);
      local_271 = iterator::operator==(&local_58,piVar2);
    }
    if ((__range4._3_1_ & 1) != 0) {
      iterator::~iterator(&local_a0);
    }
    if ((local_59 & 1) != 0) {
      iterator::~iterator(&local_58);
    }
    if (local_271 == false) {
      __range4._2_1_ = 0;
      path(__return_storage_ptr__);
      begin(&local_178,this);
      end((iterator *)((long)&__begin4._current._path.field_2 + 8),this);
      piVar2 = iterator::operator--((iterator *)((long)&__begin4._current._path.field_2 + 8));
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                (&local_138,&local_178,piVar2);
      iterator::~iterator((iterator *)((long)&__begin4._current._path.field_2 + 8));
      iterator::~iterator(&local_178);
      local_b8 = &local_138;
      input_iterator_range<ghc::filesystem::path::iterator>::begin
                ((iterator *)((long)&__end4._current._path.field_2 + 8),local_b8);
      input_iterator_range<ghc::filesystem::path::iterator>::end
                ((iterator *)((long)&s.field_2 + 8),local_b8);
      while (bVar1 = iterator::operator!=
                               ((iterator *)((long)&__end4._current._path.field_2 + 8),
                                (iterator *)((long)&s.field_2 + 8)), bVar1) {
        this_00 = iterator::operator*((iterator *)((long)&__end4._current._path.field_2 + 8));
        operator_cast_to_string((string_type *)local_258,this_00);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_258,"/");
        if (bVar1) {
          operator+=(__return_storage_ptr__,(string_type *)local_258);
        }
        else {
          operator/=(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258)
          ;
        }
        std::__cxx11::string::~string((string *)local_258);
        iterator::operator++((iterator *)((long)&__end4._current._path.field_2 + 8));
      }
      iterator::~iterator((iterator *)((long)&s.field_2 + 8));
      iterator::~iterator((iterator *)((long)&__end4._current._path.field_2 + 8));
      input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range(&local_138);
    }
    else {
      path(__return_storage_ptr__);
    }
  }
  else {
    path(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    if (has_relative_path()) {
        if (empty() || begin() == --end()) {
            return path();
        }
        else {
            path pp;
            for (string_type s : input_iterator_range<iterator>(begin(), --end())) {
                if (s == "/") {
                    // don't use append to join a path-
                    pp += s;
                }
                else {
                    pp /= s;
                }
            }
            return pp;
        }
    }
    else {
        return *this;
    }
}